

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Macintosh.cpp
# Opt level: O0

void __thiscall
Apple::Macintosh::ConcreteMachine<(Analyser::Static::Macintosh::Target::Model)2>::VIAPortHandler::
set_control_line_output(VIAPortHandler *this,Port port,Line line,bool value)

{
  char local_31;
  LogLine local_28;
  undefined1 local_19;
  Line local_18;
  Port PStack_14;
  bool value_local;
  Line line_local;
  Port port_local;
  VIAPortHandler *this_local;
  
  local_19 = value;
  local_18 = line;
  PStack_14 = port;
  _line_local = this;
  if ((port == B) && (line == Two)) {
    Macintosh::Keyboard::set_input(this->keyboard_,value);
  }
  else {
    Log::Logger<(Log::Source)17>::error((Logger<(Log::Source)17> *)&local_28);
    local_31 = 'B';
    if (PStack_14 == A) {
      local_31 = 'A';
    }
    Log::Logger<(Log::Source)17>::LogLine::append
              (&local_28,"Unhandled 6522 control line output: %c%d",(ulong)(uint)(int)local_31,
               (ulong)local_18);
    Log::Logger<(Log::Source)17>::LogLine::~LogLine(&local_28);
  }
  return;
}

Assistant:

void set_control_line_output(Port port, Line line, bool value) {
					/*
						Keyboard wiring (I believe):
						CB2 = data		(input/output)
						CB1 = clock		(input)

						CA2 is used for receiving RTC interrupts.
						CA1 is used for receiving vsync.
					*/
					if(port == Port::B && line == Line::Two) {
						keyboard_.set_input(value);
					}
					else logger.error().append("Unhandled 6522 control line output: %c%d", port ? 'B' : 'A', int(line));
				}